

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_ledb(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i32 arg3;
  TCGv_i32 m34;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  arg3 = fpinst_extract_m34(s,true,true);
  if (arg3 == (TCGv_i32)0x0) {
    s_local._4_4_ = DISAS_NORETURN;
  }
  else {
    gen_helper_ledb(tcg_ctx_00,o->out,tcg_ctx_00->cpu_env,o->in2,arg3);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
    s_local._4_4_ = DISAS_NEXT;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_ledb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 m34 = fpinst_extract_m34(s, true, true);

    if (!m34) {
        return DISAS_NORETURN;
    }
    gen_helper_ledb(tcg_ctx, o->out, tcg_ctx->cpu_env, o->in2, m34);
    tcg_temp_free_i32(tcg_ctx, m34);
    return DISAS_NEXT;
}